

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history_fini.c
# Opt level: O0

void mpt_history_fini(mpt_history *hist)

{
  FILE *__stream;
  FILE *fd;
  mpt_history *hist_local;
  
  mpt_array_clone(&hist->fmt,0);
  mpt_array_clone(&(hist->fmt)._dat,0);
  __stream = (FILE *)(hist->info).file;
  if (((__stream != (FILE *)0x0) && (__stream != _stdout)) && (__stream != _stderr)) {
    fclose(__stream);
  }
  memcpy(hist,&mpt_history_fini::def,0x28);
  return;
}

Assistant:

extern void mpt_history_fini(MPT_STRUCT(history) *hist)
{
	static const MPT_STRUCT(history) def = MPT_HISTORY_INIT;
	FILE *fd;
	/* clear file output resources */
	mpt_array_clone(&hist->fmt._fmt, 0);
	mpt_array_clone(&hist->fmt._dat, 0);
	
	if ((fd = hist->info.file) && fd != stdout && fd != stderr) {
		fclose(fd);
	}
	*hist = def;
}